

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_0::FdConnectionReceiver::accept
          (FdConnectionReceiver *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  _func_int *p_Var1;
  void *pvVar2;
  TransformPromiseNodeBase *this_00;
  ConnectionReceiver local_38;
  int local_30;
  uint uStack_2c;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  acceptImpl((FdConnectionReceiver *)&stack0xffffffffffffffc8,SUB41(__fd,0));
  p_Var1 = local_38._vptr_ConnectionReceiver[1];
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_38._vptr_ConnectionReceiver - (long)p_Var1) < 0x28) {
    pvVar2 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar2 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&stack0xffffffffffffffc8,
               kj::_::
               SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1323:35)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar2 + 0x3d8) = &PTR_destroy_00678458;
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    local_38._vptr_ConnectionReceiver[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_38._vptr_ConnectionReceiver + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&stack0xffffffffffffffc8,
               kj::_::
               SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1323:35)>
               ::anon_class_1_0_00000001_for_func::operator());
    local_38._vptr_ConnectionReceiver[-5] = (_func_int *)&PTR_destroy_00678458;
    local_38._vptr_ConnectionReceiver[-4] = p_Var1;
  }
  local_30 = 0;
  uStack_2c = 0;
  (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)this_00;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffffd8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffd0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffc8);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> accept() override {
    return acceptImpl(false).then([](AuthenticatedStream&& a) { return kj::mv(a.stream); });
  }